

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O1

void __thiscall duckdb::BufferPool::MemoryUsage::MemoryUsage(MemoryUsage *this)

{
  long lVar1;
  long lVar2;
  array<std::array<std::atomic<long>,_15UL>,_64UL> *paVar3;
  
  lVar1 = 0;
  do {
    LOCK();
    *(undefined8 *)((long)&(this->memory_usage)._M_elems[0].super___atomic_base<long>._M_i + lVar1)
         = 0;
    UNLOCK();
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x78);
  paVar3 = &this->memory_usage_caches;
  lVar1 = 0x78;
  do {
    lVar1 = lVar1 + 0x78;
    lVar2 = -0x78;
    do {
      LOCK();
      *(undefined8 *)((long)&paVar3->_M_elems[1]._M_elems[0].super___atomic_base<long>._M_i + lVar2)
           = 0;
      UNLOCK();
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0);
    paVar3 = (array<std::array<std::atomic<long>,_15UL>,_64UL> *)(paVar3->_M_elems + 1);
  } while (lVar1 != 0x1e78);
  return;
}

Assistant:

BufferPool::MemoryUsage::MemoryUsage() {
	for (auto &v : memory_usage) {
		v = 0;
	}
	for (auto &cache : memory_usage_caches) {
		for (auto &v : cache) {
			v = 0;
		}
	}
}